

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmInstallCommand.cxx
# Opt level: O2

bool __thiscall cmInstallCommand::CheckCMP0006(cmInstallCommand *this,bool *failure)

{
  cmMakefile *pcVar1;
  PolicyStatus PVar2;
  PolicyID id;
  string sStack_38;
  
  PVar2 = cmMakefile::GetPolicyStatus((this->super_cmCommand).Makefile,CMP0006);
  if (PVar2 - REQUIRED_IF_USED < 2) {
    *failure = true;
    pcVar1 = (this->super_cmCommand).Makefile;
    cmPolicies::GetRequiredPolicyError_abi_cxx11_(&sStack_38,(cmPolicies *)0x6,id);
    cmMakefile::IssueMessage(pcVar1,FATAL_ERROR,&sStack_38,false);
    std::__cxx11::string::~string((string *)&sStack_38);
  }
  else {
    if (PVar2 == OLD) {
      return true;
    }
    if (PVar2 == WARN) {
      pcVar1 = (this->super_cmCommand).Makefile;
      cmPolicies::GetPolicyWarning_abi_cxx11_(&sStack_38,(cmPolicies *)0x6,id);
      cmMakefile::IssueMessage(pcVar1,AUTHOR_WARNING,&sStack_38,false);
      std::__cxx11::string::~string((string *)&sStack_38);
      return true;
    }
  }
  return false;
}

Assistant:

bool cmInstallCommand::CheckCMP0006(bool& failure)
{
  switch(this->Makefile->GetPolicyStatus(cmPolicies::CMP0006))
    {
    case cmPolicies::WARN:
      {
      this->Makefile->IssueMessage(
        cmake::AUTHOR_WARNING,
        cmPolicies::GetPolicyWarning(cmPolicies::CMP0006)
        );
      }
    case cmPolicies::OLD:
      // OLD behavior is to allow compatibility
      return true;
    case cmPolicies::NEW:
      // NEW behavior is to disallow compatibility
      break;
    case cmPolicies::REQUIRED_IF_USED:
    case cmPolicies::REQUIRED_ALWAYS:
      failure = true;
      this->Makefile->IssueMessage(
        cmake::FATAL_ERROR,
        cmPolicies::GetRequiredPolicyError(cmPolicies::CMP0006)
        );
      break;
    }
  return false;
}